

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-utils.h
# Opt level: O2

uint64_t dg::llvmutils::getAllocatedSize(AllocaInst *AI,DataLayout *DL)

{
  Type *this;
  undefined1 auVar2 [16];
  bool bVar3;
  char cVar4;
  uint64_t uVar5;
  ulong uVar6;
  TypeSize TVar7;
  TypeSize local_30;
  undefined1 auVar1 [12];
  
  this = *(Type **)(AI + 0x40);
  uVar6 = 0;
  bVar3 = llvm::Type::isSized(this,(SmallPtrSetImpl<llvm::Type_*> *)0x0);
  if (bVar3) {
    cVar4 = llvm::AllocaInst::isArrayAllocation();
    if (cVar4 == '\0') {
      TVar7 = llvm::DataLayout::getTypeAllocSize(DL,this);
      auVar1 = TVar7.super_LinearPolySize<llvm::TypeSize>.
               super_UnivariateLinearPolyBase<llvm::TypeSize>._0_12_;
    }
    else {
      uVar5 = getConstantSizeValue(*(Value **)(AI + -0x20));
      TVar7 = llvm::DataLayout::getTypeAllocSize(DL,this);
      auVar2._8_8_ = TVar7.super_LinearPolySize<llvm::TypeSize>.
                     super_UnivariateLinearPolyBase<llvm::TypeSize>._8_8_;
      auVar2._0_8_ = TVar7.super_LinearPolySize<llvm::TypeSize>.
                     super_UnivariateLinearPolyBase<llvm::TypeSize>.Value * uVar5;
      auVar1 = auVar2._0_12_;
    }
    local_30.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
    Value = auVar1._0_8_;
    local_30.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
    UnivariateDim = auVar1._8_4_;
    uVar6 = llvm::TypeSize::operator_cast_to_unsigned_long(&local_30);
  }
  return uVar6;
}

Assistant:

inline uint64_t getAllocatedSize(const llvm::AllocaInst *AI,
                                 const llvm::DataLayout *DL) {
    llvm::Type *Ty = AI->getAllocatedType();
    if (!Ty->isSized())
        return 0;

    if (AI->isArrayAllocation()) {
        return getConstantSizeValue(AI->getArraySize()) *
               DL->getTypeAllocSize(Ty);
    }
    return DL->getTypeAllocSize(Ty);
}